

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O2

int32_t wal_get_type(uchar *buffer)

{
  uchar uVar1;
  int iVar2;
  int in_ESI;
  
  uVar1 = *buffer;
  if (uVar1 == '\x03') {
    iVar2 = invalid_name(buffer + 4,in_ESI);
    if ((iVar2 == 0) && (iVar2 = invalid_name(buffer + 0x50,in_ESI), iVar2 == 0)) {
      return 2;
    }
  }
  else if (((uVar1 == '\0' || (byte)(uVar1 - 0x20) < 0x5f) &&
           (iVar2 = invalid_name(buffer,in_ESI), iVar2 == 0)) &&
          (iVar2 = invalid_name(buffer + 0x38,in_ESI), iVar2 == 0)) {
    return 1;
  }
  return 0;
}

Assistant:

int32_t wal_get_type(const unsigned char *buffer)
{
	uint8_t version = (uint8_t)(*buffer);
	if (version == 3) {
		goto possibly_daikatana;
	} else if (is_printable(version) || (version == 0)) {
		goto possibly_quake2;
	}
	goto not_a_wal;

possibly_daikatana:
	if (invalid_name(buffer + offsetof(struct wal_dk_header, name), 0) ||
		invalid_name(buffer + offsetof(struct wal_dk_header, animname), 0)) {
		goto not_a_wal;
	}
	return WAL_TYPE_DAIKATANA;
possibly_quake2:
	if (invalid_name(buffer + offsetof(struct wal_q2_header, name), 0) ||
		invalid_name(buffer + offsetof(struct wal_q2_header, animname), 0)) {
		goto not_a_wal;
	}
	return WAL_TYPE_QUAKE2;
not_a_wal:
	return WAL_NOT_A_WAL;
}